

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabb.h
# Opt level: O0

bool __thiscall AABB::Hit(AABB *this,Ray *ray,double tmin,double tmax)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  double local_e0;
  double local_d8;
  Vec3 local_a8;
  Vec3 local_90;
  double local_78;
  double t1;
  Vec3 local_58;
  double local_40;
  double t0;
  double dStack_30;
  int i;
  double tmax_local;
  double tmin_local;
  Ray *ray_local;
  AABB *this_local;
  
  t0._4_4_ = 0;
  dStack_30 = tmax;
  tmax_local = tmin;
  tmin_local = (double)ray;
  ray_local = (Ray *)this;
  while( true ) {
    if (2 < t0._4_4_) {
      return true;
    }
    dVar3 = Vec3::operator[](&this->min_,t0._4_4_);
    Ray::origin(&local_58,(Ray *)tmin_local);
    pdVar2 = Vec3::operator[](&local_58,t0._4_4_);
    dVar1 = *pdVar2;
    Ray::direction((Vec3 *)&t1,(Ray *)tmin_local);
    pdVar2 = Vec3::operator[]((Vec3 *)&t1,t0._4_4_);
    local_40 = (dVar3 - dVar1) / *pdVar2;
    dVar3 = Vec3::operator[](&this->max_,t0._4_4_);
    Ray::origin(&local_90,(Ray *)tmin_local);
    pdVar2 = Vec3::operator[](&local_90,t0._4_4_);
    dVar1 = *pdVar2;
    Ray::direction(&local_a8,(Ray *)tmin_local);
    pdVar2 = Vec3::operator[](&local_a8,t0._4_4_);
    local_78 = (dVar3 - dVar1) / *pdVar2;
    if (local_78 < local_40) {
      std::swap<double>(&local_40,&local_78);
    }
    if (tmax_local <= local_40) {
      local_d8 = local_40;
    }
    else {
      local_d8 = tmax_local;
    }
    tmax_local = local_d8;
    if (local_78 <= dStack_30) {
      local_e0 = local_78;
    }
    else {
      local_e0 = dStack_30;
    }
    dStack_30 = local_e0;
    if (local_e0 < local_d8) break;
    t0._4_4_ = t0._4_4_ + 1;
  }
  return false;
}

Assistant:

bool Hit(const Ray& ray, double tmin, double tmax) const {
    for (int i = 0; i < 3; i++) {
      double t0 = (min_[i] - ray.origin()[i]) / ray.direction()[i];
      double t1 = (max_[i] - ray.origin()[i]) / ray.direction()[i];
      if (t0 > t1) std::swap(t0, t1);
      tmin = t0 < tmin ? tmin : t0;
      tmax = t1 > tmax ? tmax : t1;
      if (tmax < tmin) return false;
    }
    return true;
  }